

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O0

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator/=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  undefined1 local_58 [8];
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> p;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x_local;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this_local;
  
  operator*((BigInt<unsigned_int,_unsigned_long> *)&q._positive,&this->_p,&x->_q);
  operator*((BigInt<unsigned_int,_unsigned_long> *)local_58,&this->_q,&x->_p);
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&this->_p,(BigInt<unsigned_int,_unsigned_long> *)&q._positive);
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&this->_q,(BigInt<unsigned_int,_unsigned_long> *)local_58);
  _simplify(this);
  BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)local_58);
  BigInt<unsigned_int,_unsigned_long>::~BigInt((BigInt<unsigned_int,_unsigned_long> *)&q._positive);
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator/=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q;
		const TValue q = _q * x._p;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}